

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::copyAppend
          (QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *this,DeferredReleaseEntry *b,
          DeferredReleaseEntry *e)

{
  DeferredReleaseEntry *__dest;
  void *in_RDX;
  void *in_RSI;
  QArrayDataPointer<QRhiGles2::DeferredReleaseEntry> *in_RDI;
  
  if (in_RSI != in_RDX) {
    __dest = QArrayDataPointer<QRhiGles2::DeferredReleaseEntry>::end(in_RDI);
    memcpy(__dest,in_RSI,(((long)in_RDX - (long)in_RSI) / 0xc) * 0xc);
    in_RDI->size = ((long)in_RDX - (long)in_RSI) / 0xc + in_RDI->size;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }